

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

int MAFSA_automaton_val_to_int(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  int count;
  int i;
  int *out_local;
  MAFSA_letter delim_local;
  size_t sz_l_local;
  MAFSA_letter *l_local;
  
  i = (int)sz_l;
  count = 0;
  while (i = i + -1, -1 < i) {
    count = (uint)l[i] + (uint)delim * count;
  }
  *out = count;
  return 0;
}

Assistant:

extern int MAFSA_automaton_val_to_int(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;
    int count;

    for (i = sz_l - 1, count = 0; i >= 0; --i)
    {
        count *= delim;
        count += l[i];
    }

    out[0] = count;

    return 0;
}